

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Camera.cpp
# Opt level: O1

void __thiscall
Camera::update_angle
          (Camera *this,float delta_time,double mouse_x,double mouse_y,int display_w,int display_h)

{
  float fVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar2 = (double)(delta_time * this->mouse_speed);
  this->horizontal_angle =
       (float)(((double)display_w * 0.5 - mouse_x) * dVar2 + (double)this->horizontal_angle);
  fVar1 = (float)(((double)display_h * 0.5 - mouse_y) * dVar2 + (double)this->vertical_angle);
  this->vertical_angle = fVar1;
  dVar2 = cos((double)fVar1);
  dVar3 = sin((double)this->horizontal_angle);
  dVar4 = sin((double)this->vertical_angle);
  dVar5 = cos((double)this->vertical_angle);
  dVar6 = cos((double)this->horizontal_angle);
  (this->direction).field_0.x = (float)(dVar3 * dVar2);
  (this->direction).field_1.y = (float)dVar4;
  (this->direction).field_2.z = (float)(dVar6 * dVar5);
  dVar2 = sin((double)(this->horizontal_angle + -1.575795));
  dVar3 = cos((double)(this->horizontal_angle + -1.570795));
  (this->right).field_0.x = (float)dVar2;
  (this->right).field_1.y = 0.0;
  (this->right).field_2.z = (float)dVar3;
  return;
}

Assistant:

void Camera::update_angle(float delta_time, double mouse_x, double mouse_y, int display_w, int display_h) {
    horizontal_angle += mouse_speed * delta_time * (display_w/2.0 - mouse_x);
    vertical_angle   += mouse_speed * delta_time * (display_h/2.0 - mouse_y);
    
    direction = glm::vec3(
        cos(vertical_angle) * sin(horizontal_angle),
        sin(vertical_angle),
        cos(vertical_angle) * cos(horizontal_angle)
    );

    right = glm::vec3(
        sin(horizontal_angle - 3.15159f/2.0f),
        0,
        cos(horizontal_angle - 3.14159f/2.0f)
    );
}